

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_4xx7_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  switch(quads[1]) {
  case 0:
    sh4asm_txt_ldcl_armp_sr(em,quads[2]);
    break;
  case 1:
    sh4asm_txt_ldcl_armp_gbr(em,quads[2]);
    break;
  case 2:
    sh4asm_txt_ldcl_armp_vbr(em,quads[2]);
    break;
  case 3:
    sh4asm_txt_ldcl_armp_ssr(em,quads[2]);
    break;
  case 4:
    sh4asm_txt_ldcl_armp_spc(em,quads[2]);
    break;
  default:
    sh4asm_opcode_non_inst_(quads,em);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    sh4asm_txt_ldcl_armp_rn_bank(em,quads[2],quads[1] & 7);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_4xx7_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    switch (quads[1]) {
    case 0:
        sh4asm_txt_ldcl_armp_sr(em, quads[2]);
        break;
    case 1:
        sh4asm_txt_ldcl_armp_gbr(em, quads[2]);
        break;
    case 2:
        sh4asm_txt_ldcl_armp_vbr(em, quads[2]);
        break;
    case 3:
        sh4asm_txt_ldcl_armp_ssr(em, quads[2]);
        break;
    case 4:
        sh4asm_txt_ldcl_armp_spc(em, quads[2]);
        break;
    case 8:
    case 9:
    case 10:
    case 11:
    case 12:
    case 13:
    case 14:
    case 15:
        sh4asm_txt_ldcl_armp_rn_bank(em, quads[2], quads[1] & 7);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}